

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Var * kratos::copy_var_const_parm(Var *var,Generator *parent,bool check_param)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Param *param_00;
  Var *left;
  Var *right;
  UserException *this;
  undefined1 local_48 [8];
  shared_ptr<kratos::Param> param;
  
  iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x1b])();
  if ((char)iVar3 == '\0') {
    if (var->type_ == Expression) {
      Var::as<kratos::Expr>((Var *)local_48);
      left = copy_var_const_parm(*(Var **)((long)local_48 + 0x278),parent,check_param);
      if (*(Var **)((long)local_48 + 0x280) == (Var *)0x0) {
        param_00 = (Param *)Generator::expr(parent,(ExprOp)*(_func_int **)((long)local_48 + 0x270),
                                            left,(Var *)0x0);
      }
      else {
        right = copy_var_const_parm(*(Var **)((long)local_48 + 0x280),parent,check_param);
        param_00 = (Param *)Generator::expr(parent,(ExprOp)*(_func_int **)((long)local_48 + 0x270),
                                            left,right);
      }
      goto LAB_0019f3fe;
    }
    if (var->type_ != ConstValue) {
      this = (UserException *)__cxa_allocate_exception(0x10);
      local_48 = (undefined1  [8])
                 &param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Only expression with constant and parameters allowed","");
      UserException::UserException(this,(string *)local_48);
      __cxa_throw(this,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    Var::as<kratos::Const>((Var *)local_48);
    p_Var1 = *(_func_int **)((long)local_48 + 0x270);
    uVar4 = (**(code **)(*(_func_int **)local_48 + 0x38))();
    param_00 = (Param *)Const::constant((int64_t)p_Var1,uVar4,*(bool *)((long)local_48 + 0xf0));
  }
  else {
    Var::as<kratos::Param>((Var *)local_48);
    param_00 = *(Param **)((long)local_48 + 0x368);
    bVar2 = check_parent_param(param_00,parent,check_param);
    if (bVar2) goto LAB_0019f3fe;
    p_Var1 = *(_func_int **)((long)local_48 + 0x270);
    uVar4 = (**(code **)(*(_func_int **)local_48 + 0x38))();
    param_00 = (Param *)Const::constant((int64_t)p_Var1,uVar4,*(bool *)((long)local_48 + 0xf0));
  }
  (param_00->super_Const).super_Var.generator_ = parent;
LAB_0019f3fe:
  if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (Var *)param_00;
}

Assistant:

Var &copy_var_const_parm(Var *var, Generator *parent, bool check_param) {
    if (var->is_param()) {
        auto param = var->as<Param>();
        const auto *param_parent = param->parent_param();
        bool correct = check_parent_param(param_parent, parent, check_param);
        if (correct) {
            return *const_cast<Param *>(param_parent);
        } else {
            // use the current value instead
            auto &c = constant(param->value(), param->width(), param->is_signed());
            c.set_generator(parent);
            return c;
        }

    } else if (var->type() == VarType::ConstValue) {
        auto c = var->as<Const>();
        auto &c_ = constant(c->value(), c->width(), c->is_signed());
        c_.set_generator(parent);
        return c_;
    } else {
        if (var->type() != VarType::Expression)
            throw UserException("Only expression with constant and parameters allowed");
        auto expr = var->as<Expr>();
        auto &left = copy_var_const_parm(expr->left, parent, check_param);
        if (expr->right) {
            auto &right = copy_var_const_parm(expr->right, parent, check_param);
            return parent->expr(expr->op, &left, &right);
        } else {
            return parent->expr(expr->op, &left, nullptr);
        }
    }
}